

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_flush_tests.cpp
# Opt level: O0

void __thiscall
validation_flush_tests::getcoinscachesizestate::test_method(getcoinscachesizestate *this)

{
  bool bVar1;
  CoinsCacheSizeState CVar2;
  CCoinsViewCache *max_mempool_size_bytes;
  size_t sVar3;
  long in_FS_OFFSET;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int COINS_UNTIL_CRITICAL;
  int i;
  size_t MAX_COINS_CACHE_BYTES;
  CCoinsViewCache *view;
  bool is_64_bit;
  Chainstate *chainstate;
  float usage_percentage;
  anon_class_1_0_00000001 print_view_mem_usage;
  uint COIN_SIZE;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  COutPoint res_1;
  COutPoint res;
  char *in_stack_fffffffffffff4d8;
  COutPoint *in_stack_fffffffffffff4e0;
  char *in_stack_fffffffffffff4e8;
  unit_test_log_t *in_stack_fffffffffffff4f0;
  undefined4 in_stack_fffffffffffff4f8;
  int in_stack_fffffffffffff4fc;
  lazy_ostream *in_stack_fffffffffffff500;
  CCoinsViewCache *in_stack_fffffffffffff508;
  undefined7 in_stack_fffffffffffff510;
  undefined1 in_stack_fffffffffffff517;
  lazy_ostream *in_stack_fffffffffffff518;
  begin *in_stack_fffffffffffff530;
  unit_test_log_t *in_stack_fffffffffffff538;
  uchar *max_coins_cache_size_bytes;
  undefined4 in_stack_fffffffffffff540;
  CoinsCacheSizeState in_stack_fffffffffffff544;
  float local_a2c;
  int local_8bc;
  int local_8b4;
  int local_8ac;
  int local_8a4;
  int local_88c;
  COutPoint local_850 [2];
  const_string local_7f8 [2];
  lazy_ostream local_7d8 [2];
  assertion_result local_7b8 [2];
  COutPoint local_780 [2];
  COutPoint local_728 [2];
  COutPoint local_6d0 [2];
  const_string local_678 [2];
  lazy_ostream local_658 [2];
  assertion_result local_638 [2];
  const_string local_600 [2];
  lazy_ostream local_5e0 [2];
  assertion_result local_5c0 [6];
  float local_51c;
  COutPoint local_518 [2];
  COutPoint local_4c0 [2];
  COutPoint local_468 [2];
  COutPoint local_410 [2];
  size_t local_3b8;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [64];
  COutPoint local_360 [2];
  COutPoint local_304 [4];
  COutPoint local_258 [2];
  size_t local_200;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [64];
  const_string local_1a8 [2];
  lazy_ostream local_188 [2];
  undefined4 local_168;
  CoinsCacheSizeState local_164;
  assertion_result local_150 [2];
  undefined1 local_115;
  COutPoint local_114 [7];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff4d8);
  ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_fffffffffffff4e8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff4d8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff518,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
             (char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             in_stack_fffffffffffff4fc,SUB41((uint)in_stack_fffffffffffff4f8 >> 0x18,0));
  max_mempool_size_bytes =
       Chainstate::CoinsTip
                 ((Chainstate *)CONCAT44(in_stack_fffffffffffff4fc,in_stack_fffffffffffff4f8));
  local_114[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = 'P';
  local_114[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_114[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_114[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_115 = 0;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
               (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff518,
               (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
               (size_t)in_stack_fffffffffffff508,(const_string *)in_stack_fffffffffffff500);
    local_164 = Chainstate::GetCoinsCacheSizeState
                          ((Chainstate *)
                           CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                           (size_t)in_stack_fffffffffffff538,(size_t)in_stack_fffffffffffff530);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff4e0,(CoinsCacheSizeState *)in_stack_fffffffffffff4d8);
    local_168 = 2;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<CoinsCacheSizeState>,CoinsCacheSizeState>
    ::operator!=((expression_base<boost::test_tools::assertion::value_expr<CoinsCacheSizeState>,_CoinsCacheSizeState>
                  *)in_stack_fffffffffffff4e0,(CoinsCacheSizeState *)in_stack_fffffffffffff4d8);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<CoinsCacheSizeState>,_CoinsCacheSizeState,_boost::test_tools::assertion::op::NE<CoinsCacheSizeState,_CoinsCacheSizeState,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<CoinsCacheSizeState>,_CoinsCacheSizeState,_boost::test_tools::assertion::op::NE<CoinsCacheSizeState,_CoinsCacheSizeState,_void>_>
                *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
               SUB81((ulong)in_stack_fffffffffffff508 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
               (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4e0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
               (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
    in_stack_fffffffffffff4d8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_150,local_188,local_1a8,0x2c,CHECK,CHECK_BUILT_ASSERTION);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff4d8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff4d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  sVar3 = CCoinsViewCache::DynamicMemoryUsage((CCoinsViewCache *)in_stack_fffffffffffff4e8);
  if ((sVar3 == 0x20) ||
     (sVar3 = CCoinsViewCache::DynamicMemoryUsage((CCoinsViewCache *)in_stack_fffffffffffff4e8),
     sVar3 == 0x10)) {
    test_method::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)
               CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
               in_stack_fffffffffffff508);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff518,
                 (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                 (size_t)in_stack_fffffffffffff508,(const_string *)in_stack_fffffffffffff500);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff4e0,(char (*) [1])in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      local_304[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._4_8_ =
           CCoinsViewCache::DynamicMemoryUsage((CCoinsViewCache *)in_stack_fffffffffffff4e8);
      local_304[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = ' ';
      local_304[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_304[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_304[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      in_stack_fffffffffffff4e8 = "is_64_bit ? 32U : 16U";
      in_stack_fffffffffffff4e0 = local_304;
      in_stack_fffffffffffff4d8 = "view.DynamicMemoryUsage()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                ((uchar *)((long)local_304[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x1c),
                 (uchar *)((long)local_304[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0xc),0x42,1,2,
                 (uchar *)((long)local_304[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff4d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff518,
                 (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                 (size_t)in_stack_fffffffffffff508,(const_string *)in_stack_fffffffffffff500);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff4e0,(char (*) [1])in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      local_360[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._4_4_ =
           Chainstate::GetCoinsCacheSizeState
                     ((Chainstate *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                      (size_t)in_stack_fffffffffffff538,(size_t)in_stack_fffffffffffff530);
      local_360[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_360[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_360[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_360[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      in_stack_fffffffffffff4e8 = "CoinsCacheSizeState::OK";
      in_stack_fffffffffffff4e0 = local_360;
      in_stack_fffffffffffff4d8 = "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
                ((uchar *)((long)local_360[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x18),
                 (uchar *)((long)local_360[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          8),0x4d,1,2,
                 (uchar *)((long)local_360[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff4d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    for (local_8a4 = 0; local_8a4 < 3; local_8a4 = local_8a4 + 1) {
      AddTestCoin((FastRandomContext *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510)
                  ,in_stack_fffffffffffff508);
      test_method::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)
                 CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                 in_stack_fffffffffffff508);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                   (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffff518,
                   (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                   (size_t)in_stack_fffffffffffff508,(const_string *)in_stack_fffffffffffff500);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffff4e0,(char (*) [1])in_stack_fffffffffffff4d8
                  );
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                   (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
        CCoinsViewCache::AccessCoin
                  ((CCoinsViewCache *)in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
        local_3b8 = Coin::DynamicMemoryUsage((Coin *)in_stack_fffffffffffff4d8);
        in_stack_fffffffffffff4e8 = "COIN_SIZE";
        in_stack_fffffffffffff4e0 = local_114;
        in_stack_fffffffffffff4d8 = "view.AccessCoin(res).DynamicMemoryUsage()";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                  (local_3a0,local_3b0,0x52,1,2,&local_3b8);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffff4d8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                   (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffff518,
                   (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                   (size_t)in_stack_fffffffffffff508,(const_string *)in_stack_fffffffffffff500);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffff4e0,(char (*) [1])in_stack_fffffffffffff4d8
                  );
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                   (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
        local_410[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._4_4_ =
             Chainstate::GetCoinsCacheSizeState
                       ((Chainstate *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                        (size_t)in_stack_fffffffffffff538,(size_t)in_stack_fffffffffffff530);
        local_410[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
        local_410[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        local_410[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        local_410[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        in_stack_fffffffffffff4e8 = "CoinsCacheSizeState::LARGE";
        in_stack_fffffffffffff4e0 = local_410;
        in_stack_fffffffffffff4d8 = "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0)";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
                  ((uchar *)((long)local_410[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                            + 0x18),
                   (uchar *)((long)local_410[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                            + 8),0x58,1,2,
                   (uchar *)((long)local_410[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                            + 4));
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffff4d8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    for (local_8ac = 0; local_8ac < 4; local_8ac = local_8ac + 1) {
      AddTestCoin((FastRandomContext *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510)
                  ,in_stack_fffffffffffff508);
      test_method::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)
                 CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                 in_stack_fffffffffffff508);
      CVar2 = Chainstate::GetCoinsCacheSizeState
                        ((Chainstate *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540)
                         ,(size_t)in_stack_fffffffffffff538,(size_t)in_stack_fffffffffffff530);
      if (CVar2 == CRITICAL) break;
    }
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff518,
                 (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                 (size_t)in_stack_fffffffffffff508,(const_string *)in_stack_fffffffffffff500);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff4e0,(char (*) [1])in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      local_468[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._4_4_ =
           Chainstate::GetCoinsCacheSizeState
                     ((Chainstate *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                      (size_t)in_stack_fffffffffffff538,(size_t)in_stack_fffffffffffff530);
      local_468[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\x02';
      local_468[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_468[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_468[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      in_stack_fffffffffffff4e8 = "CoinsCacheSizeState::CRITICAL";
      in_stack_fffffffffffff4e0 = local_468;
      in_stack_fffffffffffff4d8 = "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
                ((uchar *)((long)local_468[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x18),
                 (uchar *)((long)local_468[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          8),0x67,1,2,
                 (uchar *)((long)local_468[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff4d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff518,
                 (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                 (size_t)in_stack_fffffffffffff508,(const_string *)in_stack_fffffffffffff500);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff4e0,(char (*) [1])in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      local_4c0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._4_4_ =
           Chainstate::GetCoinsCacheSizeState
                     ((Chainstate *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                      (size_t)in_stack_fffffffffffff538,(size_t)in_stack_fffffffffffff530);
      local_4c0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_4c0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_4c0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_4c0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      in_stack_fffffffffffff4e8 = "CoinsCacheSizeState::OK";
      in_stack_fffffffffffff4e0 = local_4c0;
      in_stack_fffffffffffff4d8 =
           "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 1 << 19)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
                ((uchar *)((long)local_4c0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x18),
                 (uchar *)((long)local_4c0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          8),0x6c,1,2,
                 (uchar *)((long)local_4c0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff4d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    for (local_8b4 = 0; local_8b4 < 3; local_8b4 = local_8b4 + 1) {
      AddTestCoin((FastRandomContext *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510)
                  ,in_stack_fffffffffffff508);
      test_method::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)
                 CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                 in_stack_fffffffffffff508);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                   (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffff518,
                   (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                   (size_t)in_stack_fffffffffffff508,(const_string *)in_stack_fffffffffffff500);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffff4e0,(char (*) [1])in_stack_fffffffffffff4d8
                  );
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                   (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
        local_518[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._4_4_ =
             Chainstate::GetCoinsCacheSizeState
                       ((Chainstate *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                        (size_t)in_stack_fffffffffffff538,(size_t)in_stack_fffffffffffff530);
        local_518[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        local_518[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        local_518[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        local_518[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        in_stack_fffffffffffff4e8 = "CoinsCacheSizeState::OK";
        in_stack_fffffffffffff4e0 = local_518;
        in_stack_fffffffffffff4d8 =
             "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 1 << 19)";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
                  ((uchar *)((long)local_518[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                            + 0x18),
                   (uchar *)((long)local_518[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                            + 8),0x73,1,2);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffff4d8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    AddTestCoin((FastRandomContext *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                in_stack_fffffffffffff508);
    test_method::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)
               CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
               in_stack_fffffffffffff508);
    sVar3 = CCoinsViewCache::DynamicMemoryUsage((CCoinsViewCache *)in_stack_fffffffffffff4e8);
    local_a2c = (float)sVar3;
    local_51c = local_a2c / 263680.0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
               (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
    boost::unit_test::log::begin::begin
              ((begin *)in_stack_fffffffffffff4e8,(const_string *)in_stack_fffffffffffff4e0,
               (size_t)in_stack_fffffffffffff4d8);
    boost::unit_test::unit_test_log_t::operator<<
              (in_stack_fffffffffffff538,in_stack_fffffffffffff530);
    boost::unit_test::unit_test_log_t::operator()
              (in_stack_fffffffffffff4f0,(log_level)((ulong)in_stack_fffffffffffff4e8 >> 0x20));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4e0,(char (*) [28])in_stack_fffffffffffff4d8);
    boost::unit_test::operator<<
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]> *)
               in_stack_fffffffffffff4e0,(float *)in_stack_fffffffffffff4d8);
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)in_stack_fffffffffffff4e8,
               (lazy_ostream *)in_stack_fffffffffffff4e0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>,_float,_const_float_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>,_float,_const_float_&>
                *)in_stack_fffffffffffff4d8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>
                        *)in_stack_fffffffffffff4d8);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)0xcf9bb3);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff518,
                 (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                 (size_t)in_stack_fffffffffffff508,(const_string *)in_stack_fffffffffffff500);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff4e8,
                 SUB81((ulong)in_stack_fffffffffffff4e0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff4e0,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      in_stack_fffffffffffff4d8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_5c0,local_5e0,local_600,0x7f,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff4d8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff4d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff518,
                 (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                 (size_t)in_stack_fffffffffffff508,(const_string *)in_stack_fffffffffffff500);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff4e8,
                 SUB81((ulong)in_stack_fffffffffffff4e0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff4e0,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      in_stack_fffffffffffff4d8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_638,local_658,local_678,0x80,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff4d8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff4d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff518,
                 (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                 (size_t)in_stack_fffffffffffff508,(const_string *)in_stack_fffffffffffff500);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff4e0,(char (*) [1])in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      local_6d0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._4_4_ =
           Chainstate::GetCoinsCacheSizeState
                     ((Chainstate *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                      (size_t)in_stack_fffffffffffff538,(size_t)in_stack_fffffffffffff530);
      local_6d0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
      local_6d0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_6d0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_6d0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      in_stack_fffffffffffff4e8 = "CoinsCacheSizeState::LARGE";
      in_stack_fffffffffffff4e0 = local_6d0;
      in_stack_fffffffffffff4d8 =
           "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 1 << 10)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
                ((uchar *)((long)local_6d0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x18),
                 (uchar *)((long)local_6d0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          8),0x83,1,2,
                 (uchar *)((long)local_6d0[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff4d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    for (local_8bc = 0; local_8bc < 1000; local_8bc = local_8bc + 1) {
      AddTestCoin((FastRandomContext *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510)
                  ,in_stack_fffffffffffff508);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                   (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffff518,
                   (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                   (size_t)in_stack_fffffffffffff508,(const_string *)in_stack_fffffffffffff500);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffff4e0,(char (*) [1])in_stack_fffffffffffff4d8
                  );
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                   (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
        local_728[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._4_4_ =
             Chainstate::GetCoinsCacheSizeState
                       ((Chainstate *)CONCAT44(in_stack_fffffffffffff4fc,in_stack_fffffffffffff4f8))
        ;
        local_728[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        local_728[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        local_728[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        local_728[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        in_stack_fffffffffffff4e8 = "CoinsCacheSizeState::OK";
        in_stack_fffffffffffff4e0 = local_728;
        in_stack_fffffffffffff4d8 = "chainstate.GetCoinsCacheSizeState()";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
                  ((uchar *)((long)local_728[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                            + 0x18),
                   (uchar *)((long)local_728[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                            + 8),0x8b,1,2,
                   (uchar *)((long)local_728[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                            + 4));
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffff4d8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff518,
                 (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                 (size_t)in_stack_fffffffffffff508,(const_string *)in_stack_fffffffffffff500);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff4e0,(char (*) [1])in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      in_stack_fffffffffffff544 =
           Chainstate::GetCoinsCacheSizeState
                     ((Chainstate *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                      (size_t)in_stack_fffffffffffff538,(size_t)in_stack_fffffffffffff530);
      local_780[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\x02';
      local_780[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_780[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_780[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      in_stack_fffffffffffff4e8 = "CoinsCacheSizeState::CRITICAL";
      in_stack_fffffffffffff4e0 = local_780;
      in_stack_fffffffffffff4d8 = "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0)";
      local_780[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._4_4_ =
           in_stack_fffffffffffff544;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
                ((uchar *)((long)local_780[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x18),
                 (uchar *)((long)local_780[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          8),0x92,1,2,
                 (uchar *)((long)local_780[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff4d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
      in_stack_fffffffffffff540 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff540);
    } while (bVar1);
    max_coins_cache_size_bytes =
         (uchar *)((long)local_114[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x14);
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff508);
    CCoinsViewCache::SetBestBlock((CCoinsViewCache *)in_stack_fffffffffffff4d8,(uint256 *)0xcfa473);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff518,
                 (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                 (size_t)in_stack_fffffffffffff508,(const_string *)in_stack_fffffffffffff500);
      CCoinsViewCache::Flush((CCoinsViewCache *)in_stack_fffffffffffff4e8);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff4e8,
                 SUB81((ulong)in_stack_fffffffffffff4e0 >> 0x38,0));
      in_stack_fffffffffffff518 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff4e0,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      in_stack_fffffffffffff4d8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_7b8,local_7d8,local_7f8,0x95,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff4d8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff4d8);
      in_stack_fffffffffffff517 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffff517);
    test_method::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)
               CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
               in_stack_fffffffffffff508);
    do {
      sVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff518,
                 (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),sVar3
                 ,(const_string *)in_stack_fffffffffffff500);
      in_stack_fffffffffffff500 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff4e0,(char (*) [1])in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      local_850[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._4_4_ =
           Chainstate::GetCoinsCacheSizeState
                     ((Chainstate *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                      (size_t)max_coins_cache_size_bytes,(size_t)max_mempool_size_bytes);
      local_850[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_850[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_850[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_850[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      in_stack_fffffffffffff4e8 = "CoinsCacheSizeState::OK";
      in_stack_fffffffffffff4e0 = local_850;
      in_stack_fffffffffffff4d8 = "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
                ((uchar *)((long)local_850[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x18),
                 (uchar *)((long)local_850[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          8),0x9a,1,2,
                 (uchar *)((long)local_850[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff4d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  else {
    for (local_88c = 0; local_88c < 1000; local_88c = local_88c + 1) {
      AddTestCoin((FastRandomContext *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510)
                  ,in_stack_fffffffffffff508);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                   (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffff518,
                   (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                   (size_t)in_stack_fffffffffffff508,(const_string *)in_stack_fffffffffffff500);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffff4e0,(char (*) [1])in_stack_fffffffffffff4d8
                  );
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                   (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
        CCoinsViewCache::AccessCoin
                  ((CCoinsViewCache *)in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
        local_200 = Coin::DynamicMemoryUsage((Coin *)in_stack_fffffffffffff4d8);
        in_stack_fffffffffffff4e8 = "COIN_SIZE";
        in_stack_fffffffffffff4e0 = local_114;
        in_stack_fffffffffffff4d8 = "view.AccessCoin(res).DynamicMemoryUsage()";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                  (local_1e8,local_1f8,0x36,1,2,&local_200);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffff4d8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff518,
                 (const_string *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                 (size_t)in_stack_fffffffffffff508,(const_string *)in_stack_fffffffffffff500);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff4e0,(char (*) [1])in_stack_fffffffffffff4d8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                 (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
      local_258[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._4_4_ =
           Chainstate::GetCoinsCacheSizeState
                     ((Chainstate *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                      (size_t)in_stack_fffffffffffff538,(size_t)in_stack_fffffffffffff530);
      local_258[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\x02';
      local_258[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_258[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_258[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      in_stack_fffffffffffff4e8 = "CoinsCacheSizeState::CRITICAL";
      in_stack_fffffffffffff4e0 = local_258;
      in_stack_fffffffffffff4d8 = "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
                ((uchar *)((long)local_258[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x18),
                 (uchar *)((long)local_258[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          8),0x3b,1,2,
                 (uchar *)((long)local_258[0].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff4d8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
               (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
    boost::unit_test::log::begin::begin
              ((begin *)in_stack_fffffffffffff4e8,(const_string *)in_stack_fffffffffffff4e0,
               (size_t)in_stack_fffffffffffff4d8);
    boost::unit_test::unit_test_log_t::operator<<
              (in_stack_fffffffffffff538,in_stack_fffffffffffff530);
    boost::unit_test::unit_test_log_t::operator()
              (in_stack_fffffffffffff4f0,(log_level)((ulong)in_stack_fffffffffffff4e8 >> 0x20));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff4e0,(char (*) [56])in_stack_fffffffffffff4d8);
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)in_stack_fffffffffffff4e8,
               (lazy_ostream *)in_stack_fffffffffffff4e0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[56],_const_char_(&)[56]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[56],_const_char_(&)[56]>
                        *)in_stack_fffffffffffff4d8);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)0xcf8d05);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff4d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(getcoinscachesizestate)
{
    Chainstate& chainstate{m_node.chainman->ActiveChainstate()};

    constexpr bool is_64_bit = sizeof(void*) == 8;

    LOCK(::cs_main);
    auto& view = chainstate.CoinsTip();

    // The number of bytes consumed by coin's heap data, i.e. CScript
    // (prevector<28, unsigned char>) when assigned 56 bytes of data per above.
    //
    // See also: Coin::DynamicMemoryUsage().
    constexpr unsigned int COIN_SIZE = is_64_bit ? 80 : 64;

    auto print_view_mem_usage = [](CCoinsViewCache& view) {
        BOOST_TEST_MESSAGE("CCoinsViewCache memory usage: " << view.DynamicMemoryUsage());
    };

    // PoolResource defaults to 256 KiB that will be allocated, so we'll take that and make it a bit larger.
    constexpr size_t MAX_COINS_CACHE_BYTES = 262144 + 512;

    // Without any coins in the cache, we shouldn't need to flush.
    BOOST_TEST(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/ 0) != CoinsCacheSizeState::CRITICAL);

    // If the initial memory allocations of cacheCoins don't match these common
    // cases, we can't really continue to make assertions about memory usage.
    // End the test early.
    if (view.DynamicMemoryUsage() != 32 && view.DynamicMemoryUsage() != 16) {
        // Add a bunch of coins to see that we at least flip over to CRITICAL.

        for (int i{0}; i < 1000; ++i) {
            const COutPoint res = AddTestCoin(m_rng, view);
            BOOST_CHECK_EQUAL(view.AccessCoin(res).DynamicMemoryUsage(), COIN_SIZE);
        }

        BOOST_CHECK_EQUAL(
            chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/0),
            CoinsCacheSizeState::CRITICAL);

        BOOST_TEST_MESSAGE("Exiting cache flush tests early due to unsupported arch");
        return;
    }

    print_view_mem_usage(view);
    BOOST_CHECK_EQUAL(view.DynamicMemoryUsage(), is_64_bit ? 32U : 16U);

    // We should be able to add COINS_UNTIL_CRITICAL coins to the cache before going CRITICAL.
    // This is contingent not only on the dynamic memory usage of the Coins
    // that we're adding (COIN_SIZE bytes per), but also on how much memory the
    // cacheCoins (unordered_map) preallocates.
    constexpr int COINS_UNTIL_CRITICAL{3};

    // no coin added, so we have plenty of space left.
    BOOST_CHECK_EQUAL(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes*/ 0),
        CoinsCacheSizeState::OK);

    for (int i{0}; i < COINS_UNTIL_CRITICAL; ++i) {
        const COutPoint res = AddTestCoin(m_rng, view);
        print_view_mem_usage(view);
        BOOST_CHECK_EQUAL(view.AccessCoin(res).DynamicMemoryUsage(), COIN_SIZE);

        // adding first coin causes the MemoryResource to allocate one 256 KiB chunk of memory,
        // pushing us immediately over to LARGE
        BOOST_CHECK_EQUAL(
            chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/ 0),
            CoinsCacheSizeState::LARGE);
    }

    // Adding some additional coins will push us over the edge to CRITICAL.
    for (int i{0}; i < 4; ++i) {
        AddTestCoin(m_rng, view);
        print_view_mem_usage(view);
        if (chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/0) ==
            CoinsCacheSizeState::CRITICAL) {
            break;
        }
    }

    BOOST_CHECK_EQUAL(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/0),
        CoinsCacheSizeState::CRITICAL);

    // Passing non-zero max mempool usage (512 KiB) should allow us more headroom.
    BOOST_CHECK_EQUAL(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/ 1 << 19),
        CoinsCacheSizeState::OK);

    for (int i{0}; i < 3; ++i) {
        AddTestCoin(m_rng, view);
        print_view_mem_usage(view);
        BOOST_CHECK_EQUAL(
            chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/ 1 << 19),
            CoinsCacheSizeState::OK);
    }

    // Adding another coin with the additional mempool room will put us >90%
    // but not yet critical.
    AddTestCoin(m_rng, view);
    print_view_mem_usage(view);

    // Only perform these checks on 64 bit hosts; I haven't done the math for 32.
    if (is_64_bit) {
        float usage_percentage = (float)view.DynamicMemoryUsage() / (MAX_COINS_CACHE_BYTES + (1 << 10));
        BOOST_TEST_MESSAGE("CoinsTip usage percentage: " << usage_percentage);
        BOOST_CHECK(usage_percentage >= 0.9);
        BOOST_CHECK(usage_percentage < 1);
        BOOST_CHECK_EQUAL(
            chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes*/ 1 << 10), // 1024
            CoinsCacheSizeState::LARGE);
    }

    // Using the default max_* values permits way more coins to be added.
    for (int i{0}; i < 1000; ++i) {
        AddTestCoin(m_rng, view);
        BOOST_CHECK_EQUAL(
            chainstate.GetCoinsCacheSizeState(),
            CoinsCacheSizeState::OK);
    }

    // Flushing the view does take us back to OK because ReallocateCache() is called

    BOOST_CHECK_EQUAL(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0),
        CoinsCacheSizeState::CRITICAL);

    view.SetBestBlock(m_rng.rand256());
    BOOST_CHECK(view.Flush());
    print_view_mem_usage(view);

    BOOST_CHECK_EQUAL(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0),
        CoinsCacheSizeState::OK);
}